

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<13>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  undefined8 in_RAX;
  long lVar1;
  RepeatedField<unsigned_int> *array;
  long lVar2;
  undefined8 uStack_38;
  
  if (0 < *field) {
    lVar2 = 0;
    lVar1 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44(md->tag,(undefined4)uStack_38);
      PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
      PrimitiveTypeHelper<13>::Serialize((void *)(*(long *)((long)field + 8) + lVar2),output);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 4;
    } while (lVar1 < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }